

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

uint FSE_optimalTableLog_internal(uint maxTableLog,size_t srcSize,uint maxSymbolValue,uint minus)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  U32 tableLog;
  
  if (1 < srcSize) {
    uVar2 = (uint)srcSize;
    iVar1 = 0x1f;
    if (uVar2 - 1 != 0) {
      for (; uVar2 - 1 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    uVar4 = 0x1f;
    if (maxSymbolValue != 0) {
      for (; maxSymbolValue >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar3 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = (uVar3 ^ 0xffffffe0) + 0x21;
    uVar2 = (uVar4 ^ 0xffffffe0) + 0x22;
    if (uVar3 < uVar2) {
      uVar2 = uVar3;
    }
    uVar4 = 0xb;
    if (maxTableLog != 0) {
      uVar4 = maxTableLog;
    }
    if (iVar1 - minus < uVar4) {
      uVar4 = iVar1 - minus;
    }
    if (uVar4 < uVar2) {
      uVar4 = uVar2;
    }
    uVar2 = 5;
    if (5 < uVar4) {
      uVar2 = uVar4;
    }
    uVar4 = 0xc;
    if (uVar2 < 0xc) {
      uVar4 = uVar2;
    }
    return uVar4;
  }
  __assert_fail("srcSize > 1",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x3913,"unsigned int FSE_minTableLog(size_t, unsigned int)");
}

Assistant:

unsigned FSE_optimalTableLog_internal(unsigned maxTableLog, size_t srcSize, unsigned maxSymbolValue, unsigned minus)
{
    U32 maxBitsSrc = ZSTD_highbit32((U32)(srcSize - 1)) - minus;
    U32 tableLog = maxTableLog;
    U32 minBits = FSE_minTableLog(srcSize, maxSymbolValue);
    assert(srcSize > 1); /* Not supported, RLE should be used instead */
    if (tableLog==0) tableLog = FSE_DEFAULT_TABLELOG;
    if (maxBitsSrc < tableLog) tableLog = maxBitsSrc;   /* Accuracy can be reduced */
    if (minBits > tableLog) tableLog = minBits;   /* Need a minimum to safely represent all symbol values */
    if (tableLog < FSE_MIN_TABLELOG) tableLog = FSE_MIN_TABLELOG;
    if (tableLog > FSE_MAX_TABLELOG) tableLog = FSE_MAX_TABLELOG;
    return tableLog;
}